

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::CallbackErrorCase::expectMessage
          (CallbackErrorCase *this,GLenum source,GLenum type)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_48 [16];
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  BaseCase::verifyMessage(&this->super_BaseCase,&this->m_lastMessage,source,type);
  local_38._M_p = (pointer)&local_28;
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  local_48._8_4_ = 0;
  local_48._12_4_ = 0;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  MessageData::operator=(&this->m_lastMessage,(MessageData *)local_48);
  std::__cxx11::string::~string((string *)&local_38);
  iVar1 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  return;
}

Assistant:

void CallbackErrorCase::expectMessage (GLenum source, GLenum type)
{
	verifyMessage(m_lastMessage, source, type);
	m_lastMessage = MessageData();

	// Reset error so that code afterwards (such as glu::ShaderProgram) doesn't break because of
	// lingering error state.
	m_context.getRenderContext().getFunctions().getError();
}